

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serial_arena.h
# Opt level: O1

void * __thiscall
google::protobuf::internal::SerialArena::
AllocateAligned<(google::protobuf::internal::AllocationClient)0>(SerialArena *this,size_t n)

{
  bool bVar1;
  string *n_00;
  SerialArena *pSVar2;
  void *pvVar3;
  SerialArena *pSVar4;
  ThreadSafeArena *this_00;
  SerialArena *unaff_R14;
  void *ptr;
  atomic<char_*> local_20;
  
  if ((n & 7) == 0) {
    pSVar4 = (SerialArena *)(this->ptr_)._M_b._M_p;
    pSVar2 = (SerialArena *)this->limit_;
    unaff_R14 = this;
    if (pSVar4 <= pSVar2) {
      n_00 = (string *)0x0;
      goto LAB_0013457c;
    }
  }
  else {
    pSVar2 = (SerialArena *)&stack0xffffffffffffffe0;
    pSVar4 = (SerialArena *)n;
    AllocateAligned<(google::protobuf::internal::AllocationClient)0>(pSVar2);
  }
  n_00 = absl::lts_20240722::log_internal::MakeCheckOpString<char_const*,char_const*>
                   ((char *)pSVar2,(char *)pSVar4,"limit_ >= ptr()");
LAB_0013457c:
  if (n_00 != (string *)0x0) {
    this_00 = (ThreadSafeArena *)&stack0xffffffffffffffe0;
    AllocateAligned<(google::protobuf::internal::AllocationClient)0>();
    pSVar2 = ThreadSafeArena::GetSerialArenaFallback(this_00,(size_t)n_00);
    pvVar3 = AllocateAligned<(google::protobuf::internal::AllocationClient)1>(pSVar2,(size_t)n_00);
    return pvVar3;
  }
  bVar1 = MaybeAllocateAligned(unaff_R14,n,(void **)&stack0xffffffffffffffe0);
  if (!bVar1) {
    local_20._M_b._M_p = (__base_type)AllocateAlignedFallback(unaff_R14,n);
  }
  return (void *)local_20._M_b._M_p;
}

Assistant:

void* AllocateAligned(size_t n) {
    ABSL_DCHECK(internal::ArenaAlignDefault::IsAligned(n));
    ABSL_DCHECK_GE(limit_, ptr());

    if (alloc_client == AllocationClient::kArray) {
      if (void* res = TryAllocateFromCachedBlock(n)) {
        return res;
      }
    }

    void* ptr;
    if (PROTOBUF_PREDICT_TRUE(MaybeAllocateAligned(n, &ptr))) {
      return ptr;
    }
    return AllocateAlignedFallback(n);
  }